

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O3

path * mp::GetExecutablePath(void)

{
  ulong uVar1;
  SystemError *this;
  int *piVar2;
  path *in_RDI;
  undefined **local_248;
  char *local_240;
  ulong local_238;
  ulong local_230;
  char local_228 [504];
  
  local_230 = 500;
  local_248 = &PTR_grow_002ee1c8;
  local_238 = 500;
  local_240 = local_228;
  uVar1 = readlink("/proc/self/exe",local_228,500);
  while( true ) {
    if ((long)uVar1 < 0) {
      this = (SystemError *)__cxa_allocate_exception(0x18);
      piVar2 = __errno_location();
      fmt::SystemError::SystemError(this,*piVar2,(CStringRef)0x27bee0);
      __cxa_throw(this,&fmt::SystemError::typeinfo,fmt::SystemError::~SystemError);
    }
    if (uVar1 != local_238) break;
    uVar1 = uVar1 * 2;
    if (local_230 < uVar1) {
      (*(code *)*local_248)(&local_248,uVar1);
    }
    local_238 = uVar1;
    uVar1 = readlink("/proc/self/exe",local_240,uVar1);
  }
  (in_RDI->str_)._M_dataplus._M_p = (pointer)&(in_RDI->str_).field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  local_248 = &PTR_grow_002ee1c8;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  return in_RDI;
}

Assistant:

path mp::GetExecutablePath() {
  fmt::internal::MemoryBuffer<char, BUFFER_SIZE> buffer;
  buffer.resize(BUFFER_SIZE);
  ssize_t size = 0;
  for (;;) {
    size = readlink("/proc/self/exe", &buffer[0], buffer.size());
    if (size < 0)
      throw SystemError(errno, "cannot get executable path");
    if (static_cast<size_t>(size) != buffer.size()) break;
    buffer.resize(2 * buffer.size());
  }
  const char *s = &buffer[0];
  return path(s, s + size);
}